

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

void __thiscall
flatbuffers::cpp::CppGenerator::GenDefaultConstructor(CppGenerator *this,StructDef *struct_def)

{
  Definition *pDVar1;
  bool bVar2;
  reference ppFVar3;
  Value *pVVar4;
  Value *pVVar5;
  ulong uVar6;
  allocator<char> local_321;
  string local_320;
  allocator<char> local_2f9;
  string local_2f8;
  allocator<char> local_2d1;
  string local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  string local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170;
  allocator<char> local_149;
  string local_148;
  Value *local_128;
  Value *native_default;
  string local_118;
  Value *local_f8;
  Value *cpp_type;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_e0;
  const_iterator it;
  string initializer_list;
  string local_b0;
  string local_90;
  string local_70;
  allocator<char> local_39;
  string local_38;
  StructDef *local_18;
  StructDef *struct_def_local;
  CppGenerator *this_local;
  
  local_18 = struct_def;
  struct_def_local = (StructDef *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"NATIVE_NAME",&local_39);
  Name_abi_cxx11_(&local_90,this,&local_18->super_Definition);
  NativeName(&local_70,&local_90,local_18,&(this->opts_).super_IDLOptions);
  CodeWriter::SetValue(&this->code_,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  if (*(int *)&(this->opts_).super_IDLOptions.field_0x30c < 1) {
    std::__cxx11::string::string((string *)&it);
    local_e0._M_current =
         (FieldDef **)
         std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                   (&(local_18->fields).vec);
    while( true ) {
      field = (FieldDef *)
              std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                        (&(local_18->fields).vec);
      bVar2 = __gnu_cxx::operator!=
                        (&local_e0,
                         (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                          *)&field);
      if (!bVar2) break;
      ppFVar3 = __gnu_cxx::
                __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                ::operator*(&local_e0);
      cpp_type = (Value *)*ppFVar3;
      if (((((FieldDef *)cpp_type)->deprecated & 1U) == 0) &&
         ((((FieldDef *)cpp_type)->value).type.base_type != BASE_TYPE_UTYPE)) {
        pDVar1 = &((FieldDef *)cpp_type)->super_Definition;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_118,"cpp_type",(allocator<char> *)((long)&native_default + 7));
        pVVar4 = SymbolTable<flatbuffers::Value>::Lookup(&pDVar1->attributes,&local_118);
        std::__cxx11::string::~string((string *)&local_118);
        std::allocator<char>::~allocator((allocator<char> *)((long)&native_default + 7));
        pVVar5 = cpp_type + 1;
        local_f8 = pVVar4;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_148,"native_default",&local_149);
        pVVar5 = SymbolTable<flatbuffers::Value>::Lookup
                           ((SymbolTable<flatbuffers::Value> *)&(pVVar5->type).enum_def,&local_148);
        std::__cxx11::string::~string((string *)&local_148);
        std::allocator<char>::~allocator(&local_149);
        local_128 = pVVar5;
        bVar2 = IsScalar(*(BaseType *)((long)&cpp_type[2].constant.field_2 + 8));
        if (bVar2) {
          uVar6 = std::__cxx11::string::empty();
          if ((uVar6 & 1) == 0) {
            std::__cxx11::string::operator+=((string *)&it,",\n        ");
          }
          Name_abi_cxx11_(&local_170,this,(FieldDef *)cpp_type);
          std::__cxx11::string::operator+=((string *)&it,(string *)&local_170);
          std::__cxx11::string::~string((string *)&local_170);
          if (local_128 == (Value *)0x0) {
            GetDefaultScalarValue_abi_cxx11_(&local_1d0,this,(FieldDef *)cpp_type,true);
          }
          else {
            std::__cxx11::string::string((string *)&local_1d0,(string *)&local_128->constant);
          }
          std::operator+(&local_1b0,"(",&local_1d0);
          std::operator+(&local_190,&local_1b0,")");
          std::__cxx11::string::operator+=((string *)&it,(string *)&local_190);
          std::__cxx11::string::~string((string *)&local_190);
          std::__cxx11::string::~string((string *)&local_1b0);
          std::__cxx11::string::~string((string *)&local_1d0);
        }
        else if (*(int *)((long)&cpp_type[2].constant.field_2 + 8) == 0xf) {
          bVar2 = IsStruct((Type *)((long)&cpp_type[2].constant.field_2 + 8));
          if ((bVar2) && (local_128 != (Value *)0x0)) {
            uVar6 = std::__cxx11::string::empty();
            if ((uVar6 & 1) == 0) {
              std::__cxx11::string::operator+=((string *)&it,",\n        ");
            }
            Name_abi_cxx11_(&local_250,this,(FieldDef *)cpp_type);
            std::operator+(&local_230,&local_250,"(");
            std::operator+(&local_210,&local_230,&local_128->constant);
            std::operator+(&local_1f0,&local_210,")");
            std::__cxx11::string::operator+=((string *)&it,(string *)&local_1f0);
            std::__cxx11::string::~string((string *)&local_1f0);
            std::__cxx11::string::~string((string *)&local_210);
            std::__cxx11::string::~string((string *)&local_230);
            std::__cxx11::string::~string((string *)&local_250);
          }
        }
        else if ((local_f8 != (Value *)0x0) &&
                (bVar2 = IsVector((Type *)((long)&cpp_type[2].constant.field_2 + 8)), !bVar2)) {
          uVar6 = std::__cxx11::string::empty();
          if ((uVar6 & 1) == 0) {
            std::__cxx11::string::operator+=((string *)&it,",\n        ");
          }
          Name_abi_cxx11_(&local_290,this,(FieldDef *)cpp_type);
          std::operator+(&local_270,&local_290,"(0)");
          std::__cxx11::string::operator+=((string *)&it,(string *)&local_270);
          std::__cxx11::string::~string((string *)&local_270);
          std::__cxx11::string::~string((string *)&local_290);
        }
      }
      __gnu_cxx::
      __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
      ::operator++(&local_e0);
    }
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::operator+(&local_2b0,"\n      : ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it);
      std::__cxx11::string::operator=((string *)&it,(string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_2b0);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"INIT_LIST",&local_2d1);
    CodeWriter::SetValue(&this->code_,&local_2d0,(string *)&it);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::allocator<char>::~allocator(&local_2d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f8,"  {{NATIVE_NAME}}(){{INIT_LIST}} {",&local_2f9);
    CodeWriter::operator+=(&this->code_,&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::allocator<char>::~allocator(&local_2f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_320,"  }",&local_321);
    CodeWriter::operator+=(&this->code_,&local_320);
    std::__cxx11::string::~string((string *)&local_320);
    std::allocator<char>::~allocator(&local_321);
    std::__cxx11::string::~string((string *)&it);
  }
  else {
    bVar2 = NeedsCopyCtorAssignOp(this,local_18);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"  {{NATIVE_NAME}}() = default;",
                 (allocator<char> *)(initializer_list.field_2._M_local_buf + 0xf));
      CodeWriter::operator+=(&this->code_,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator
                ((allocator<char> *)(initializer_list.field_2._M_local_buf + 0xf));
    }
  }
  return;
}

Assistant:

void GenDefaultConstructor(const StructDef &struct_def) {
    code_.SetValue("NATIVE_NAME",
                   NativeName(Name(struct_def), &struct_def, opts_));
    // In >= C++11, default member initializers are generated. To allow for
    // aggregate initialization, do not emit a default constructor at all, with
    // the exception of types that need a copy/move ctors and assignment
    // operators.
    if (opts_.g_cpp_std >= cpp::CPP_STD_11) {
      if (NeedsCopyCtorAssignOp(struct_def)) {
        code_ += "  {{NATIVE_NAME}}() = default;";
      }
      return;
    }
    std::string initializer_list;
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const auto &field = **it;
      if (!field.deprecated &&  // Deprecated fields won't be accessible.
          field.value.type.base_type != BASE_TYPE_UTYPE) {
        auto cpp_type = field.attributes.Lookup("cpp_type");
        auto native_default = field.attributes.Lookup("native_default");
        // Scalar types get parsed defaults, raw pointers get nullptrs.
        if (IsScalar(field.value.type.base_type)) {
          if (!initializer_list.empty()) { initializer_list += ",\n        "; }
          initializer_list += Name(field);
          initializer_list +=
              "(" +
              (native_default ? std::string(native_default->constant)
                              : GetDefaultScalarValue(field, true)) +
              ")";
        } else if (field.value.type.base_type == BASE_TYPE_STRUCT) {
          if (IsStruct(field.value.type)) {
            if (native_default) {
              if (!initializer_list.empty()) {
                initializer_list += ",\n        ";
              }
              initializer_list +=
                  Name(field) + "(" + native_default->constant + ")";
            }
          }
        } else if (cpp_type && !IsVector(field.value.type)) {
          if (!initializer_list.empty()) { initializer_list += ",\n        "; }
          initializer_list += Name(field) + "(0)";
        }
      }
    }
    if (!initializer_list.empty()) {
      initializer_list = "\n      : " + initializer_list;
    }

    code_.SetValue("INIT_LIST", initializer_list);

    code_ += "  {{NATIVE_NAME}}(){{INIT_LIST}} {";
    code_ += "  }";
  }